

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall
ncnn::Net::register_custom_layer
          (Net *this,char *type,layer_creator_func creator,layer_destroyer_func destroyer,
          void *userdata)

{
  pointer *ppcVar1;
  pointer *ppoVar2;
  NetPrivate *pNVar3;
  iterator __position;
  pointer poVar4;
  iterator __position_00;
  pointer pcVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  overwrite_builtin_layer_registry_entry entry;
  custom_layer_registry_entry local_50;
  
  uVar6 = layer_to_index(type);
  local_50.creator = creator;
  local_50.destroyer = destroyer;
  local_50.userdata = userdata;
  if (uVar6 == 0xffffffff) {
    iVar7 = (*this->_vptr_Net[2])(this,type);
    if (iVar7 == -1) {
      pNVar3 = this->d;
      __position._M_current =
           (pNVar3->custom_layer_registry).
           super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pNVar3->custom_layer_registry).
          super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_50.name = type;
        std::
        vector<ncnn::custom_layer_registry_entry,std::allocator<ncnn::custom_layer_registry_entry>>
        ::_M_realloc_insert<ncnn::custom_layer_registry_entry_const&>
                  ((vector<ncnn::custom_layer_registry_entry,std::allocator<ncnn::custom_layer_registry_entry>>
                    *)&pNVar3->custom_layer_registry,__position,&local_50);
      }
      else {
        (__position._M_current)->destroyer = destroyer;
        (__position._M_current)->userdata = userdata;
        (__position._M_current)->name = type;
        (__position._M_current)->creator = creator;
        ppcVar1 = &(pNVar3->custom_layer_registry).
                   super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
    }
    else {
      fprintf(_stderr,"overwrite existing custom layer type %s",type);
      fputc(10,_stderr);
      pcVar5 = (this->d->custom_layer_registry).
               super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar5[iVar7].name = type;
      pcVar5[iVar7].creator = creator;
      pcVar5[iVar7].destroyer = destroyer;
      pcVar5[iVar7].userdata = userdata;
    }
  }
  else {
    fprintf(_stderr,"overwrite built-in layer type %s",type);
    fputc(10,_stderr);
    poVar4 = (this->d->overwrite_builtin_layer_registry).
             super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)(this->d->overwrite_builtin_layer_registry).
                  super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)poVar4;
    if (lVar8 != 0) {
      lVar8 = lVar8 >> 5;
      lVar8 = lVar8 + (ulong)(lVar8 == 0);
      lVar9 = 0;
      do {
        if (*(uint *)((long)&poVar4->typeindex + lVar9) == uVar6) {
          fprintf(_stderr,"overwrite existing overwritten built-in layer index %d",(ulong)uVar6);
          fputc(10,_stderr);
          poVar4 = (this->d->overwrite_builtin_layer_registry).
                   super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(layer_creator_func *)((long)&poVar4->creator + lVar9) = creator;
          *(layer_destroyer_func *)((long)&poVar4->destroyer + lVar9) = destroyer;
          *(void **)((long)&poVar4->userdata + lVar9) = userdata;
          return 0;
        }
        lVar9 = lVar9 + 0x20;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    local_50.name = (char *)CONCAT44(local_50.name._4_4_,uVar6);
    pNVar3 = this->d;
    __position_00._M_current =
         (pNVar3->overwrite_builtin_layer_registry).
         super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (pNVar3->overwrite_builtin_layer_registry).
        super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<ncnn::overwrite_builtin_layer_registry_entry,std::allocator<ncnn::overwrite_builtin_layer_registry_entry>>
      ::_M_realloc_insert<ncnn::overwrite_builtin_layer_registry_entry_const&>
                ((vector<ncnn::overwrite_builtin_layer_registry_entry,std::allocator<ncnn::overwrite_builtin_layer_registry_entry>>
                  *)&pNVar3->overwrite_builtin_layer_registry,__position_00,
                 (overwrite_builtin_layer_registry_entry *)&local_50);
    }
    else {
      (__position_00._M_current)->destroyer = destroyer;
      (__position_00._M_current)->userdata = userdata;
      *(char **)__position_00._M_current = local_50.name;
      (__position_00._M_current)->creator = creator;
      ppoVar2 = &(pNVar3->overwrite_builtin_layer_registry).
                 super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppoVar2 = *ppoVar2 + 1;
    }
  }
  return 0;
}

Assistant:

int Net::register_custom_layer(const char* type, layer_creator_func creator, layer_destroyer_func destroyer, void* userdata)
{
    int typeindex = layer_to_index(type);
    if (typeindex != -1)
    {
        NCNN_LOGE("overwrite built-in layer type %s", type);

        for (size_t i = 0; i < d->overwrite_builtin_layer_registry.size(); i++)
        {
            if (d->overwrite_builtin_layer_registry[i].typeindex == typeindex)
            {
                NCNN_LOGE("overwrite existing overwritten built-in layer index %d", typeindex);

                d->overwrite_builtin_layer_registry[i].creator = creator;
                d->overwrite_builtin_layer_registry[i].destroyer = destroyer;
                d->overwrite_builtin_layer_registry[i].userdata = userdata;
                return 0;
            }
        }

        struct overwrite_builtin_layer_registry_entry entry = {typeindex, creator, destroyer, userdata};
        d->overwrite_builtin_layer_registry.push_back(entry);
        return 0;
    }

    int custom_index = custom_layer_to_index(type);
    if (custom_index == -1)
    {
        struct custom_layer_registry_entry entry = {type, creator, destroyer, userdata};
        d->custom_layer_registry.push_back(entry);
    }
    else
    {
        NCNN_LOGE("overwrite existing custom layer type %s", type);
        d->custom_layer_registry[custom_index].name = type;
        d->custom_layer_registry[custom_index].creator = creator;
        d->custom_layer_registry[custom_index].destroyer = destroyer;
        d->custom_layer_registry[custom_index].userdata = userdata;
    }

    return 0;
}